

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit_3chan(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  exr_coding_channel_info_t *peVar9;
  long lVar10;
  void *pvVar11;
  int iVar12;
  void *pvVar13;
  void *pvVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  ulong uVar18;
  uint8_t *puVar19;
  ulong uVar20;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar9 = decode->channels;
    uVar2 = peVar9->width;
    iVar3 = peVar9[2].user_pixel_stride;
    iVar4 = peVar9[1].user_pixel_stride;
    iVar5 = peVar9->user_pixel_stride;
    puVar15 = peVar9[2].field_12.decode_to_ptr;
    puVar19 = (peVar9->field_12).decode_to_ptr;
    puVar17 = peVar9[1].field_12.decode_to_ptr;
    iVar6 = peVar9[2].user_line_stride;
    iVar7 = peVar9[1].user_line_stride;
    iVar8 = peVar9->user_line_stride;
    pvVar14 = decode->unpacked_buffer;
    lVar10 = (long)(int)(uVar2 * 6);
    uVar18 = (ulong)uVar2;
    pvVar13 = (void *)((long)pvVar14 + (long)(int)uVar2 * 2);
    pvVar11 = (void *)((long)pvVar14 + (long)(int)uVar2 * 4);
    iVar12 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar20 = 0;
        puVar16 = puVar19;
        do {
          *(undefined2 *)puVar16 = *(undefined2 *)((long)pvVar14 + uVar20 * 2);
          uVar20 = uVar20 + 1;
          puVar16 = puVar16 + iVar5;
        } while (uVar18 != uVar20);
      }
      if (0 < (int)uVar2) {
        uVar20 = 0;
        puVar16 = puVar17;
        do {
          *(undefined2 *)puVar16 = *(undefined2 *)((long)pvVar13 + uVar20 * 2);
          uVar20 = uVar20 + 1;
          puVar16 = puVar16 + iVar4;
        } while (uVar18 != uVar20);
      }
      if (0 < (int)uVar2) {
        uVar20 = 0;
        puVar16 = puVar15;
        do {
          *(undefined2 *)puVar16 = *(undefined2 *)((long)pvVar11 + uVar20 * 2);
          uVar20 = uVar20 + 1;
          puVar16 = puVar16 + iVar3;
        } while (uVar18 != uVar20);
      }
      pvVar14 = (void *)((long)pvVar14 + lVar10);
      puVar19 = puVar19 + iVar8;
      puVar17 = puVar17 + iVar7;
      puVar15 = puVar15 + iVar6;
      iVar12 = iVar12 + 1;
      pvVar13 = (void *)((long)pvVar13 + lVar10);
      pvVar11 = (void *)((long)pvVar11 + lVar10);
    } while (iVar12 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t *       out0, *out1, *out2;
    int             w, h;
    int             inc0, inc1, inc2;
    int             linc0, linc1, linc2;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    inc0  = decode->channels[0].user_pixel_stride;
    inc1  = decode->channels[1].user_pixel_stride;
    inc2  = decode->channels[2].user_pixel_stride;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;

    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out0 + x * inc0)) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out1 + x * inc1)) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out2 + x * inc2)) = one_to_native16 (in2[x]);
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
    }

    return EXR_ERR_SUCCESS;
}